

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O2

zt_mem_pool * zt_mem_pool_get(char *name)

{
  zt_mem_pool *pzVar1;
  char *__s;
  zt_elist_t *pzVar2;
  int iVar3;
  size_t __n;
  size_t sVar4;
  zt_mem_pool *pool;
  
  if (name != (char *)0x0) {
    __n = strlen(name);
    pzVar2 = &pools;
    while (pzVar1 = (zt_mem_pool *)pzVar2->next, pzVar1 != (zt_mem_pool *)&pools) {
      __s = pzVar1->name;
      sVar4 = strlen(__s);
      if ((sVar4 == __n) && (iVar3 = strncmp(name,__s,__n), iVar3 == 0)) {
        return pzVar1;
      }
      pzVar2 = &pzVar1->pool_list;
    }
  }
  return (zt_mem_pool *)0x0;
}

Assistant:

zt_mem_pool *
zt_mem_pool_get(char *name)
{
    size_t       nlen;
    zt_elist_t * tmp;

    if (!name) {
        return 0;
    }

    nlen = strlen(name);

    zt_elist_for_each(&pools, tmp) {
        zt_mem_pool * pool;
        size_t        olen;

        pool = zt_elist_data(tmp, zt_mem_pool, pool_list);
        olen = strlen(pool->name);

        if (olen == nlen && (strncmp(name, pool->name, nlen) == 0)) {
            return pool;
        }
    }

    return 0;
}